

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiments.cpp
# Opt level: O0

void FLT(ffe_t *data,uint size,uint skewIndex,uint output_elements)

{
  short sVar1;
  ffe_t fVar2;
  uint in_ECX;
  ushort *puVar3;
  uint in_EDX;
  ushort *puVar4;
  uint in_ESI;
  long in_RDI;
  uint i;
  ffe_t skew;
  uint j;
  ffe_t *skewLUT;
  uint width;
  undefined4 local_44;
  undefined4 local_3c;
  undefined4 local_30;
  
  for (local_30 = in_ESI >> 1; local_30 != 0; local_30 = local_30 >> 1) {
    for (local_3c = 0; local_3c < in_ECX; local_3c = local_30 * 2 + local_3c) {
      sVar1 = *(short *)((ulong)local_30 * 2 + (ulong)in_EDX * 2 + 0x10508e + (ulong)local_3c * 2);
      for (local_44 = local_3c; local_44 < local_3c + local_30; local_44 = local_44 + 1) {
        puVar4 = (ushort *)(in_RDI + (ulong)local_44 * 2);
        puVar3 = (ushort *)(in_RDI + (ulong)(local_44 + local_30) * 2);
        if (sVar1 != -1) {
          fVar2 = mulE(0,0x10);
          *puVar4 = *puVar4 ^ fVar2;
        }
        *puVar3 = *puVar3 ^ *puVar4;
      }
    }
  }
  return;
}

Assistant:

static void FLT(ffe_t* data, const unsigned size, const unsigned skewIndex, const unsigned output_elements)
{
    for (unsigned width = (size >> 1); width > 0; width >>= 1)
    {
        const ffe_t* skewLUT = skewVec + width + skewIndex - 1;

        for (unsigned j = 0; j < output_elements; j += (width << 1))
        {
            const ffe_t skew = skewLUT[j];

            for (unsigned i = j; i < j + width; ++i)
                fft_butterfly(data[i], data[i + width], skew);
        }
    }
}